

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::fusedMultiplyAdd
          (IEEEFloat *this,IEEEFloat *multiplicand,IEEEFloat *addend,roundingMode rounding_mode)

{
  bool bVar1;
  lostFraction lost_fraction_00;
  opStatus local_28;
  lostFraction lost_fraction;
  opStatus fs;
  roundingMode rounding_mode_local;
  IEEEFloat *addend_local;
  IEEEFloat *multiplicand_local;
  IEEEFloat *this_local;
  
  this->field_0x12 =
       this->field_0x12 & 0xf7 |
       ((byte)this->field_0x12 >> 3 & 1 ^ (byte)multiplicand->field_0x12 >> 3 & 1) << 3;
  bVar1 = isFiniteNonZero(this);
  if (((bVar1) && (bVar1 = isFiniteNonZero(multiplicand), bVar1)) &&
     (bVar1 = isFinite(addend), bVar1)) {
    lost_fraction_00 = multiplySignificand(this,multiplicand,addend);
    local_28 = normalize(this,rounding_mode,lost_fraction_00);
    if (lost_fraction_00 != lfExactlyZero) {
      local_28 = local_28 | opInexact;
    }
    if ((((this->field_0x12 & 7) == 3) && ((local_28 & opUnderflow) == opOK)) &&
       (((byte)this->field_0x12 >> 3 & 1) != ((byte)addend->field_0x12 >> 3 & 1))) {
      this->field_0x12 = this->field_0x12 & 0xf7 | (rounding_mode == rmTowardNegative) << 3;
    }
  }
  else {
    local_28 = multiplySpecials(this,multiplicand);
    if (local_28 == opOK) {
      local_28 = addOrSubtract(this,addend,rounding_mode,false);
    }
  }
  return local_28;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::fusedMultiplyAdd(const IEEEFloat &multiplicand,
                                                const IEEEFloat &addend,
                                                roundingMode rounding_mode) {
  opStatus fs;

  /* Post-multiplication sign, before addition.  */
  sign ^= multiplicand.sign;

  /* If and only if all arguments are normal do we need to do an
     extended-precision calculation.  */
  if (isFiniteNonZero() &&
      multiplicand.isFiniteNonZero() &&
      addend.isFinite()) {
    lostFraction lost_fraction;

    lost_fraction = multiplySignificand(multiplicand, &addend);
    fs = normalize(rounding_mode, lost_fraction);
    if (lost_fraction != lfExactlyZero)
      fs = (opStatus) (fs | opInexact);

    /* If two numbers add (exactly) to zero, IEEE 754 decrees it is a
       positive zero unless rounding to minus infinity, except that
       adding two like-signed zeroes gives that zero.  */
    if (category == fcZero && !(fs & opUnderflow) && sign != addend.sign)
      sign = (rounding_mode == rmTowardNegative);
  } else {
    fs = multiplySpecials(multiplicand);

    /* FS can only be opOK or opInvalidOp.  There is no more work
       to do in the latter case.  The IEEE-754R standard says it is
       implementation-defined in this case whether, if ADDEND is a
       quiet NaN, we raise invalid op; this implementation does so.

       If we need to do the addition we can do so with normal
       precision.  */
    if (fs == opOK)
      fs = addOrSubtract(addend, rounding_mode, false);
  }

  return fs;
}